

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O3

int __thiscall fmt::v8::file::pipe(file *this,int *__pipedes)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  uint *puVar3;
  int __fd;
  int *piVar4;
  format_string<> fmt;
  int fds [2];
  file local_24;
  int local_20 [2];
  
  piVar4 = __pipedes;
  close(this,(int)__pipedes);
  __fd = (int)piVar4;
  close((file *)__pipedes,__fd);
  local_20[0] = 0;
  local_20[1] = 0;
  iVar1 = ::pipe(local_20);
  if (iVar1 == 0) {
    iVar1 = local_20[0];
    local_24.fd_ = local_20[0];
    close(this,__fd);
    this->fd_ = iVar1;
    local_24.fd_ = -1;
    ~file(&local_24);
    iVar1 = local_20[1];
    local_24.fd_ = local_20[1];
    close((file *)__pipedes,__fd);
    *__pipedes = iVar1;
    local_24.fd_ = -1;
    ~file(&local_24);
    return extraout_EAX;
  }
  uVar2 = __cxa_allocate_exception(0x20);
  puVar3 = (uint *)__errno_location();
  fmt.str_.data_ = (char *)(ulong)*puVar3;
  fmt.str_.size_ = (size_t)"cannot create pipe";
  system_error<>((int)uVar2,fmt);
  __cxa_throw(uVar2,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

void file::pipe(file& read_end, file& write_end) {
  // Close the descriptors first to make sure that assignments don't throw
  // and there are no leaks.
  read_end.close();
  write_end.close();
  int fds[2] = {};
#  ifdef _WIN32
  // Make the default pipe capacity same as on Linux 2.6.11+.
  enum { DEFAULT_CAPACITY = 65536 };
  int result = FMT_POSIX_CALL(pipe(fds, DEFAULT_CAPACITY, _O_BINARY));
#  else
  // Don't retry as the pipe function doesn't return EINTR.
  // http://pubs.opengroup.org/onlinepubs/009696799/functions/pipe.html
  int result = FMT_POSIX_CALL(pipe(fds));
#  endif
  if (result != 0) FMT_THROW(system_error(errno, "cannot create pipe"));
  // The following assignments don't throw because read_fd and write_fd
  // are closed.
  read_end = file(fds[0]);
  write_end = file(fds[1]);
}